

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall
Assimp::FBXExporter::WriteModelNode
          (FBXExporter *this,StreamWriterLE *outstream,bool binary,aiNode *node,int64_t node_uid,
          string *type,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          *transform_chain,TransformInheritance inherit_type)

{
  pointer pcVar1;
  pointer ppVar2;
  int iVar3;
  long *plVar4;
  const_iterator cVar5;
  runtime_error *this_00;
  long *plVar6;
  undefined7 in_register_00000011;
  _Base_ptr name_00;
  pointer __k;
  aiVector3D s;
  aiVector3D r;
  aiVector3D t;
  string name;
  stringstream err;
  Node p;
  Node m;
  string local_3c8;
  string local_3a8;
  string local_388;
  aiVector3t<float> local_368;
  aiVector3t<float> local_35c;
  aiVector3t<float> local_350;
  undefined4 local_344;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [23];
  StreamWriterLE *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  FBXExportProperty local_150;
  FBXExportProperty local_130;
  Node local_110;
  Node local_a0;
  
  local_344 = (undefined4)CONCAT71(in_register_00000011,binary);
  local_320._0_8_ = local_320 + 0x10;
  local_198 = outstream;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Model","");
  local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,local_320._0_8_,(pointer)(local_320._0_8_ + local_320._8_8_));
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.force_has_children = false;
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                 (node->mName).data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FBX::SEPARATOR_abi_cxx11_);
  plVar4 = (long *)std::__cxx11::string::append(local_320);
  local_340 = &local_330;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_330 = *plVar6;
    lStack_328 = plVar4[3];
  }
  else {
    local_330 = *plVar6;
    local_340 = (long *)*plVar4;
  }
  local_338 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_340,local_338 + (long)local_340);
  pcVar1 = (type->_M_dataplus)._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar1,pcVar1 + type->_M_string_length);
  FBX::Node::AddProperties<long,std::__cxx11::string,std::__cxx11::string>
            (&local_a0,node_uid,&local_170,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Version","");
  FBX::Node::AddChild<int>(&local_a0,(string *)local_320,0xe8);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Properties70","");
  local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_320._0_8_,(pointer)(local_320._0_8_ + local_320._8_8_));
  local_110.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_110.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.force_has_children = false;
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"RotationActive","");
  FBX::Node::AddP70bool(&local_110,(string *)local_320,true);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"DefaultAttributeIndex","");
  FBX::Node::AddP70int(&local_110,(string *)local_320,0);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"InheritType","");
  FBX::Node::AddP70enum(&local_110,(string *)local_320,inherit_type);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  __k = (transform_chain->
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (transform_chain->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k != ppVar2) {
    do {
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
              ::find(&transform_types_abi_cxx11_._M_t,&__k->first);
      if ((_Rb_tree_header *)cVar5._M_node ==
          &transform_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_320 + 0x10),"unrecognized FBX transformation type: ",0x26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_320 + 0x10),(__k->first)._M_dataplus._M_p,
                   (__k->first)._M_string_length);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,(string *)&local_3c8);
        *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      name_00 = cVar5._M_node + 2;
      iVar3 = std::__cxx11::string::compare((ulong)name_00,0,(char *)0x4);
      if (iVar3 == 0) {
        local_320._0_8_ = local_320 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"");
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"A","");
        FBX::Node::AddP70<double,double,double>
                  (&local_110,(string *)name_00,(string *)name_00,(string *)local_320,&local_3c8,
                   (double)(__k->second).x,(double)(__k->second).y,(double)(__k->second).z);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
        }
      }
      else {
        FBX::Node::AddP70vector
                  (&local_110,(string *)name_00,(double)(__k->second).x,(double)(__k->second).y,
                   (double)(__k->second).z);
      }
      __k = __k + 1;
    } while (__k != ppVar2);
    goto LAB_0034b2e1;
  }
  local_350.x = 0.0;
  local_350.y = 0.0;
  local_350.z = 0.0;
  local_35c.x = 0.0;
  local_35c.y = 0.0;
  local_35c.z = 0.0;
  local_368.x = 0.0;
  local_368.y = 0.0;
  local_368.z = 0.0;
  aiMatrix4x4t<float>::Decompose(&node->mTransformation,&local_368,&local_35c,&local_350);
  if ((local_350.x != 0.0) || (NAN(local_350.x))) {
LAB_0034aee8:
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Lcl Translation","");
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Lcl Translation","");
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"A","");
    FBX::Node::AddP70<double,double,double>
              (&local_110,(string *)local_320,&local_3c8,&local_388,&local_3a8,(double)local_350.x,
               (double)local_350.y,(double)local_350.z);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
    }
  }
  else if ((local_350.y != 0.0) ||
          (((NAN(local_350.y) || (local_350.z != 0.0)) || (NAN(local_350.z))))) goto LAB_0034aee8;
  if ((local_35c.x != 0.0) || (NAN(local_35c.x))) {
LAB_0034b043:
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Lcl Rotation","");
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Lcl Rotation","");
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"A","");
    FBX::Node::AddP70<double,double,double>
              (&local_110,(string *)local_320,&local_3c8,&local_388,&local_3a8,
               (double)(local_35c.x * 57.29578),(double)(local_35c.y * 57.29578),
               (double)(local_35c.z * 57.29578));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
    }
  }
  else if (((local_35c.y != 0.0) || ((NAN(local_35c.y) || (local_35c.z != 0.0)))) ||
          (NAN(local_35c.z))) goto LAB_0034b043;
  if ((local_368.x == 1.0) && (!NAN(local_368.x))) {
    if ((local_368.y == 1.0) &&
       (((!NAN(local_368.y) && (local_368.z == 1.0)) && (!NAN(local_368.z))))) goto LAB_0034b2e1;
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Lcl Scaling","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Lcl Scaling","");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"A","");
  FBX::Node::AddP70<double,double,double>
            (&local_110,(string *)local_320,&local_3c8,&local_388,&local_3a8,(double)local_368.x,
             (double)local_368.y,(double)local_368.z);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
LAB_0034b2e1:
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&local_a0.children,&local_110);
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Shading","");
  FBX::FBXExportProperty::FBXExportProperty(&local_130,true);
  FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>(&local_a0,(string *)local_320,&local_130);
  if (local_130.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Culling","");
  FBX::FBXExportProperty::FBXExportProperty(&local_150,"CullingOff",false);
  FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>(&local_a0,(string *)local_320,&local_150);
  if (local_150.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  FBX::Node::Dump(&local_a0,local_198,local_344._0_1_,1);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_110.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_110.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
    operator_delete(local_110.name._M_dataplus._M_p,local_110.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_a0.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_a0.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p,local_a0.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXExporter::WriteModelNode(
    StreamWriterLE& outstream,
    bool binary,
    const aiNode* node,
    int64_t node_uid,
    const std::string& type,
    const std::vector<std::pair<std::string,aiVector3D>>& transform_chain,
    TransformInheritance inherit_type
){
    const aiVector3D zero = {0, 0, 0};
    const aiVector3D one = {1, 1, 1};
    FBX::Node m("Model");
    std::string name = node->mName.C_Str() + FBX::SEPARATOR + "Model";
    m.AddProperties(node_uid, name, type);
    m.AddChild("Version", int32_t(232));
    FBX::Node p("Properties70");
    p.AddP70bool("RotationActive", 1);
    p.AddP70int("DefaultAttributeIndex", 0);
    p.AddP70enum("InheritType", inherit_type);
    if (transform_chain.empty()) {
        // decompose 4x4 transform matrix into TRS
        aiVector3D t, r, s;
        node->mTransformation.Decompose(s, r, t);
        if (t != zero) {
            p.AddP70(
                "Lcl Translation", "Lcl Translation", "", "A",
                double(t.x), double(t.y), double(t.z)
            );
        }
        if (r != zero) {
            p.AddP70(
                "Lcl Rotation", "Lcl Rotation", "", "A",
                double(DEG*r.x), double(DEG*r.y), double(DEG*r.z)
            );
        }
        if (s != one) {
            p.AddP70(
                "Lcl Scaling", "Lcl Scaling", "", "A",
                double(s.x), double(s.y), double(s.z)
            );
        }
    } else {
        // apply the transformation chain.
        // these transformation elements are created when importing FBX,
        // which has a complex transformation hierarchy for each node.
        // as such we can bake the hierarchy back into the node on export.
        for (auto &item : transform_chain) {
            auto elem = transform_types.find(item.first);
            if (elem == transform_types.end()) {
                // then this is a bug
                std::stringstream err;
                err << "unrecognized FBX transformation type: ";
                err << item.first;
                throw DeadlyExportError(err.str());
            }
            const std::string &name = elem->second.first;
            const aiVector3D &v = item.second;
            if (name.compare(0, 4, "Lcl ") == 0) {
                // special handling for animatable properties
                p.AddP70(
                    name, name, "", "A",
                    double(v.x), double(v.y), double(v.z)
                );
            } else {
                p.AddP70vector(name, v.x, v.y, v.z);
            }
        }
    }
    m.AddChild(p);

    // not sure what these are for,
    // but they seem to be omnipresent
    m.AddChild("Shading", FBXExportProperty(true));
    m.AddChild("Culling", FBXExportProperty("CullingOff"));

    m.Dump(outstream, binary, 1);
}